

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O0

void __thiscall
PartiallySignedTransaction::PartiallySignedTransaction(PartiallySignedTransaction *this)

{
  long lVar1;
  optional<CMutableTransaction> *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::optional<CMutableTransaction>::optional(in_RDI);
  std::
  map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
  ::map((map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
         *)in_RDI);
  std::vector<PSBTInput,_std::allocator<PSBTInput>_>::vector
            ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)in_RDI);
  std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::vector
            ((vector<PSBTOutput,_std::allocator<PSBTOutput>_> *)in_RDI);
  std::
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::map((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)in_RDI);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)in_RDI);
  std::set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>::set
            ((set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_> *)
             in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PartiallySignedTransaction() = default;